

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall
helics::CommsInterface::addRoute(CommsInterface *this,route_id rid,string_view routeInfo)

{
  size_t size;
  ActionMessage route;
  ActionMessage local_e0;
  
  size = routeInfo._M_len;
  ActionMessage::ActionMessage(&local_e0,cmd_protocol_priority);
  local_e0.payload.bufferSize = size;
  if ((local_e0.payload.heap != (byte *)routeInfo._M_str) &&
     (SmallBuffer::reserve(&local_e0.payload,size), size != 0)) {
    memcpy(local_e0.payload.heap,routeInfo._M_str,size);
  }
  local_e0.messageID = 0xe9;
  local_e0.dest_handle.hid = rid.rid;
  transmit(this,(route_id)0xffffffff,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommsInterface::addRoute(route_id rid, std::string_view routeInfo)
{
    ActionMessage route(CMD_PROTOCOL_PRIORITY);
    route.payload = routeInfo;
    route.messageID = NEW_ROUTE;
    route.setExtraData(rid.baseValue());
    transmit(control_route, std::move(route));
}